

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rounded_box.cxx
# Opt level: O0

void rbox(int fill,int x,int y,int w,int h)

{
  int iVar1;
  int local_24;
  int rsy;
  int rs;
  int i;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  int fill_local;
  
  local_24 = (w << 1) / 5;
  iVar1 = (h << 1) / 5;
  if (iVar1 < local_24) {
    local_24 = iVar1;
  }
  if (0xf < local_24) {
    local_24 = 0xf;
  }
  if (local_24 == 5) {
    local_24 = 4;
  }
  if (local_24 == 7) {
    local_24 = 8;
  }
  if (fill == 0) {
    fl_begin_loop();
  }
  else {
    fl_begin_polygon();
  }
  for (rsy = 0; rsy < 5; rsy = rsy + 1) {
    fl_vertex_r(offset[4 - rsy] * (double)local_24 + (double)x,
                offset[rsy] * (double)local_24 + (double)y);
  }
  for (rsy = 0; rsy < 5; rsy = rsy + 1) {
    fl_vertex_r(offset[rsy] * (double)local_24 + (double)x,
                -offset[4 - rsy] * (double)local_24 + (double)(y + h + -1));
  }
  for (rsy = 0; rsy < 5; rsy = rsy + 1) {
    fl_vertex_r(-offset[4 - rsy] * (double)local_24 + (double)(x + w + -1),
                -offset[rsy] * (double)local_24 + (double)(y + h + -1));
  }
  for (rsy = 0; rsy < 5; rsy = rsy + 1) {
    fl_vertex_r(-offset[rsy] * (double)local_24 + (double)(x + w + -1),
                offset[4 - rsy] * (double)local_24 + (double)y);
  }
  if (fill == 0) {
    fl_end_loop();
  }
  else {
    fl_end_polygon();
  }
  return;
}

Assistant:

static void rbox(int fill, int x, int y, int w, int h) {
  int i;
  int rs, rsy;
  rs = w*2/5; rsy = h*2/5;
  if (rs > rsy) rs = rsy; // use smaller radius
  if (rs > RS) rs = RS;
  if (rs == 5) rs = 4;	// use only even sizes for small corners (STR #2943)
  if (rs == 7) rs = 8;	// note: 8 is better than 6 (really)

  if (fill) fl_begin_polygon(); else fl_begin_loop();
  for (i=0; i<RN; i++)
    fl_vertex_r(x + offset[RN-i-1]*rs, y + offset[i] * rs);
  for (i=0; i<RN; i++)
    fl_vertex_r(x + offset[i]*rs, y + h-1 - offset[RN-i-1] * rs);
  for (i=0; i<RN; i++)
    fl_vertex_r(x + w-1 - offset[RN-i-1]*rs, y + h-1 - offset[i] * rs);
  for (i=0; i<RN; i++)
    fl_vertex_r(x + w-1 - offset[i]*rs, y + offset[RN-i-1] * rs);
  if (fill) fl_end_polygon(); else fl_end_loop();
}